

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax
          (UnarySelectPropertyExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  SelectorSyntax *syntax_00;
  AssertionExpr *this_00;
  UnaryAssertionOperator UVar1;
  int iVar2;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar3;
  bitmask<slang::ast::ASTFlags> addedFlags;
  bool bVar4;
  SequenceRange SVar5;
  UnaryAssertionOperator op;
  _Storage<slang::ast::SequenceRange,_true> local_68;
  bool local_5c;
  ASTContext local_58;
  
  this = ((context->scope).ptr)->compilation;
  UVar1 = getUnaryOp((syntax->op).kind);
  local_5c = false;
  syntax_00 = syntax->selector;
  op = UVar1;
  if (syntax_00 == (SelectorSyntax *)0x0) {
    bVar4 = false;
  }
  else {
    SVar5 = SequenceRange::fromSyntax(syntax_00,context,UVar1 == SEventually || UVar1 == Always);
    local_68._0_8_ = SVar5._0_8_;
    local_68._M_value.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged =
         (bool)SVar5.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
    bVar4 = SVar5.min != 0;
  }
  local_5c = syntax_00 != (SelectorSyntax *)0x0;
  if (((Eventually < UVar1) || ((0x2aU >> (UVar1 & 0x1f) & 1) == 0)) ||
     (addedFlags.m_bits = 0x400000, !bVar4)) {
    addedFlags.m_bits = (underlying_type)((~UVar1 & 1) << 0x15);
  }
  this_00 = (AssertionExpr *)(syntax->expr).ptr;
  ASTContext::resetFlags(&local_58,context,addedFlags);
  iVar2 = AssertionExpr::bind(this_00,(int)&local_58,(sockaddr *)0x0,0);
  pUVar3 = BumpAllocator::
           emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRange>&>
                     (&this->super_BumpAllocator,&op,(AssertionExpr *)CONCAT44(extraout_var,iVar2),
                      (optional<slang::ast::SequenceRange> *)&local_68._M_value);
  return &pUVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& UnaryAssertionExpr::fromSyntax(const UnarySelectPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto op = getUnaryOp(syntax.op.kind);

    std::optional<SequenceRange> range;
    if (syntax.selector) {
        bool allowUnbounded = op == UnaryAssertionOperator::Always ||
                              op == UnaryAssertionOperator::SEventually;
        range = SequenceRange::fromSyntax(*syntax.selector, context, allowUnbounded);
    }

    bitmask<ASTFlags> extraFlags;
    if ((op == UnaryAssertionOperator::Always || op == UnaryAssertionOperator::NextTime ||
         op == UnaryAssertionOperator::Eventually) &&
        range && range->min > 0) {
        extraFlags = ASTFlags::PropertyTimeAdvance;
    }
    else if (isNegationOp(op)) {
        extraFlags = ASTFlags::PropertyNegation;
    }

    auto& expr = bind(*syntax.expr, context.resetFlags(extraFlags));

    return *comp.emplace<UnaryAssertionExpr>(op, expr, range);
}